

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O2

SpatialForceVector *
iDynTree::transformWrenchEfficient<iDynTree::SpatialForceVector>
          (SpatialForceVector *__return_storage_ptr__,Transform *op1,SpatialForceVector *op2)

{
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> p;
  Transform *local_98 [2];
  type local_88;
  AngularVector3T *local_70 [2];
  SpatialVector<iDynTree::SpatialForceVector> *local_60 [2];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_50;
  
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[1] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[1] = 0.0;
  __return_storage_ptr__->_vptr_SpatialForceVector = (_func_int **)&PTR__SpatialForceVector_00237ca8
  ;
  local_50.m_lhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)&op2->super_SpatialVector<iDynTree::SpatialForceVector>;
  local_98[0] = op1;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)&__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>;
  local_50.m_lhs.m_lhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)&op1->rot;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>,0>>
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_88,
             &local_50.m_lhs);
  local_60[0] = &__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>;
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_88,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>> *)
             local_98,(MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                       *)local_60);
  local_50.m_lhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)&(op2->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3;
  local_70[0] = &(__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).
                 angularVec3;
  local_50.m_lhs.m_lhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)&op1->rot;
  local_50.m_rhs = &local_88;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_70,
             &local_50);
  return __return_storage_ptr__;
}

Assistant:

spatialForceType transformWrenchEfficient(const Transform& op1, const spatialForceType& op2)
    {
        spatialForceType ret;

        Eigen::Map<const Eigen::Vector3d> p(op1.getPosition().data());
        Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > R(op1.getRotation().data());

        toEigen(ret.getLinearVec3()) = R*toEigen(op2.getLinearVec3());
        toEigen(ret.getAngularVec3())  = R*toEigen(op2.getAngularVec3()) + p.cross(toEigen(ret.getLinearVec3()));

        return ret;
    }